

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_unicode.c
# Opt level: O0

uint32_t C_decode_utf8(C_Parser *tokenizer,char **new_pos,char *p)

{
  int local_3c;
  uint local_38;
  int i;
  uint32_t c;
  int len;
  char *start;
  char *p_local;
  char **new_pos_local;
  C_Parser *tokenizer_local;
  
  if ((byte)*p < 0x80) {
    *new_pos = p + 1;
    tokenizer_local._4_4_ = (uint)*p;
  }
  else {
    if ((byte)*p < 0xf0) {
      if ((byte)*p < 0xe0) {
        if ((byte)*p < 0xc0) {
          C_error_at(tokenizer,p,"invalid UTF-8 sequence");
        }
        i = 2;
        local_38 = (int)*p & 0x1f;
      }
      else {
        i = 3;
        local_38 = (int)*p & 0xf;
      }
    }
    else {
      i = 4;
      local_38 = (int)*p & 7;
    }
    for (local_3c = 1; local_3c < i; local_3c = local_3c + 1) {
      if ((int)(uint)(byte)p[local_3c] >> 6 != 2) {
        C_error_at(tokenizer,p,"invalid UTF-8 sequence");
      }
      local_38 = local_38 << 6 | (int)p[local_3c] & 0x3fU;
    }
    *new_pos = p + i;
    tokenizer_local._4_4_ = local_38;
  }
  return tokenizer_local._4_4_;
}

Assistant:

uint32_t C_decode_utf8(C_Parser *tokenizer, char **new_pos, char *p) {
  if ((unsigned char)*p < 128) {
    *new_pos = p + 1;
    return *p;
  }

  char *start = p;
  int len;
  uint32_t c;

  if ((unsigned char)*p >= 0b11110000) {
    len = 4;
    c = *p & 0b111;
  } else if ((unsigned char)*p >= 0b11100000) {
    len = 3;
    c = *p & 0b1111;
  } else if ((unsigned char)*p >= 0b11000000) {
    len = 2;
    c = *p & 0b11111;
  } else {
	  C_error_at(tokenizer, start, "invalid UTF-8 sequence");
  }

  for (int i = 1; i < len; i++) {
    if ((unsigned char)p[i] >> 6 != 0b10)
	    C_error_at(tokenizer, start, "invalid UTF-8 sequence");
    c = (c << 6) | (p[i] & 0b111111);
  }

  *new_pos = p + len;
  return c;
}